

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

ConfigBlockSymbol *
slang::ast::ConfigBlockSymbol::fromSyntax(Scope *scope,ConfigDeclarationSyntax *syntax)

{
  Compilation *this;
  size_t sVar1;
  pointer ppPVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation loc;
  ConfigBlockSymbol *this_00;
  long lVar3;
  string_view name;
  
  this = scope->compilation;
  name = parsing::Token::valueText(&syntax->name);
  loc = parsing::Token::location(&syntax->name);
  this_00 = Compilation::allocConfigBlock(this,name,loc);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  sVar1 = (syntax->localparams).
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppPVar2 = (syntax->localparams).
              super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
              ._M_ptr;
    lVar3 = 0;
    do {
      Scope::addMembers(&this_00->super_Scope,*(SyntaxNode **)((long)ppPVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return this_00;
}

Assistant:

ConfigBlockSymbol& ConfigBlockSymbol::fromSyntax(const Scope& scope,
                                                 const ConfigDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.allocConfigBlock(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    for (auto param : syntax.localparams)
        result->addMembers(*param);

    return *result;
}